

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O2

void generate_gf(void)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  alpha_of[8] = 0;
  uVar1 = 1;
  lVar3 = 0;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    *(uint *)((long)alpha_of + lVar3) = uVar1;
    index_of[uVar1] = (uint)lVar4;
    if (*(int *)((long)p + lVar3) != 0) {
      alpha_of[8] = alpha_of[8] ^ uVar1;
    }
    uVar1 = uVar1 * 2;
    lVar3 = lVar3 + 4;
  }
  uVar2 = (ulong)alpha_of[8];
  index_of[uVar2] = 8;
  for (lVar3 = 9; lVar3 != 0xff; lVar3 = lVar3 + 1) {
    uVar1 = (uint)uVar2;
    if (uVar1 < 0x80) {
      uVar1 = uVar1 * 2;
    }
    else {
      uVar1 = uVar1 * 2 ^ alpha_of[8] ^ 0x100;
    }
    uVar2 = (ulong)uVar1;
    alpha_of[lVar3] = uVar1;
    index_of[uVar2] = (uint)lVar3;
  }
  index_of[0] = 0xffffffff;
  return;
}

Assistant:

void generate_gf()
{
    uint32_t i, mask;

    mask = 1;
    alpha_of[m] = 0;

    for (i = 0; i < m; i++)
    {
        alpha_of[i] = mask;
        index_of[alpha_of[i]] = i;

        if (p[i] != 0)
            alpha_of[m] ^= mask;
        mask <<= 1;
    }
    index_of[alpha_of[m]] = m;
    mask >>= 1;

    for (i = m + 1; i < pow2(m) - 1; i++)
    {
        if (alpha_of[i - 1] >= mask)
            alpha_of[i] = alpha_of[m] ^ ((alpha_of[i - 1] ^ mask) << 1);
        else
            alpha_of[i] = alpha_of[i - 1] << 1;

        index_of[alpha_of[i]] = i;
    }
    index_of[0] = -1;
}